

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix::
SammyBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (SammyBackgroundRMatrix *this,ControlRecord *record,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  long lVar1;
  ListRecord local_68;
  
  lVar1 = (record->
          super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
          ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
          _M_head_impl;
  ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_68,it,end,lineNumber,MAT,MF,MT);
  Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix::SammyBackgroundRMatrix
            ((SammyBackgroundRMatrix *)this,(int)lVar1,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_68.data.super__Vector_base<double,_std::allocator<double>_>);
  Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix::verifyLBK
            ((int)(record->
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                  _M_head_impl);
  return;
}

Assistant:

SammyBackgroundRMatrix( ControlRecord&& record,
                        Iterator& it, const Iterator& end, long& lineNumber,
                        int MAT, int MF, int MT ) :
  SammyBackgroundRMatrix(
      record.L1(),
      ListRecord( it, end, lineNumber, MAT, MF, MT ) ) {

    verifyLBK( record.L2() );
  }